

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.cpp
# Opt level: O2

void __thiscall embree::LineSegments::commit(LineSegments *this)

{
  ulong uVar1;
  byte *pbVar2;
  int *piVar3;
  uint uVar4;
  RawBufferView *pRVar5;
  BufferView<embree::Vec3fa> *pBVar6;
  long lVar7;
  RawBufferView *pRVar8;
  undefined8 *puVar9;
  Buffer *this_00;
  long lVar10;
  bool bVar11;
  BufferView<embree::Vec3fa> *pBVar12;
  size_t numBytes_in;
  char cVar13;
  bool bVar14;
  allocator local_51;
  Ref<embree::Buffer> buffer;
  
  pRVar5 = &((this->vertices).items)->super_RawBufferView;
  lVar10 = 0;
  while ((ulong)(this->super_Geometry).numTimeSteps * 0x38 + 0x38 != lVar10 + 0x38) {
    piVar3 = (int *)((long)&pRVar5->stride + lVar10);
    lVar10 = lVar10 + 0x38;
    if (*piVar3 != (int)pRVar5->stride) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&buffer,
                 "stride of vertex buffers have to be identical for each time step",&local_51);
      *puVar9 = &PTR__rtcore_error_021d38e0;
      *(undefined4 *)(puVar9 + 1) = 3;
      std::__cxx11::string::string((string *)(puVar9 + 2),(string *)&buffer);
      __cxa_throw(puVar9,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
  }
  pBVar6 = (this->normals).items;
  lVar10 = (this->normals).size_active * 0x38;
  pBVar12 = pBVar6;
  while (lVar10 != 0) {
    pRVar8 = &pBVar12->super_RawBufferView;
    pBVar12 = pBVar12 + 1;
    lVar10 = lVar10 + -0x38;
    if ((int)pRVar8->stride != (int)(pBVar6->super_RawBufferView).stride) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&buffer,
                 "stride of normal buffers have to be identical for each time step",&local_51);
      *puVar9 = &PTR__rtcore_error_021d38e0;
      *(undefined4 *)(puVar9 + 1) = 3;
      std::__cxx11::string::string((string *)(puVar9 + 2),(string *)&buffer);
      __cxa_throw(puVar9,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
  }
  RawBufferView::operator=(&(this->vertices0).super_RawBufferView,pRVar5);
  if (((uint)(this->super_Geometry).field_8 & 3) == 2) {
    RawBufferView::operator=
              (&(this->normals0).super_RawBufferView,&((this->normals).items)->super_RawBufferView);
  }
  if ((this->flags).super_RawBufferView.buffer.ptr == (Buffer *)0x0) {
    (this->flags).super_RawBufferView.userData = 0;
    numBytes_in = (size_t)(this->super_Geometry).numPrimitives;
LAB_0025193e:
    this_00 = (Buffer *)::operator_new(0x30);
    Buffer::Buffer(this_00,(this->super_Geometry).device,numBytes_in,(void *)0x0,(void *)0x0);
    buffer.ptr = this_00;
    (*(this_00->super_RefCount)._vptr_RefCount[2])(this_00);
    RawBufferView::set(&(this->flags).super_RawBufferView,&buffer,0,1,
                       (ulong)(this->super_Geometry).numPrimitives,RTC_FORMAT_UCHAR);
    if (buffer.ptr != (Buffer *)0x0) {
      (*((buffer.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    cVar13 = (this->flags).super_RawBufferView.userData == 0;
  }
  else {
    if ((this->flags).super_RawBufferView.userData != 0) goto LAB_00251a1c;
    numBytes_in = (size_t)(this->super_Geometry).numPrimitives;
    if ((this->flags).super_RawBufferView.num != numBytes_in) goto LAB_0025193e;
    cVar13 = this->field_0x80;
  }
  if (cVar13 != '\0') {
    lVar10 = 1;
    bVar11 = false;
    while( true ) {
      uVar1 = lVar10 - 1;
      uVar4 = (this->super_Geometry).numPrimitives;
      if (uVar4 <= uVar1) break;
      if (uVar1 == uVar4 - 1) {
        bVar14 = false;
      }
      else {
        lVar7 = *(long *)&(this->super_Geometry).field_0x58;
        bVar14 = *(int *)(lVar7 + *(long *)&this->field_0x68 * lVar10) ==
                 *(int *)(lVar7 + *(long *)&this->field_0x68 * uVar1) + 1;
      }
      (this->flags).super_RawBufferView.ptr_ofs[(this->flags).super_RawBufferView.stride * uVar1] =
           bVar11;
      pbVar2 = (byte *)((this->flags).super_RawBufferView.ptr_ofs +
                       uVar1 * (this->flags).super_RawBufferView.stride);
      *pbVar2 = *pbVar2 | bVar14 * '\x02';
      lVar10 = lVar10 + 1;
      bVar11 = bVar14;
    }
  }
LAB_00251a1c:
  this->field_0x80 = 0;
  Geometry::commit(&this->super_Geometry);
  return;
}

Assistant:

void LineSegments::commit() 
  {
    /* verify that stride of all time steps are identical */
    for (unsigned int t=0; t<numTimeSteps; t++) {
      if (vertices[t].getStride() != vertices[0].getStride())
        throw_RTCError(RTC_ERROR_INVALID_OPERATION,"stride of vertex buffers have to be identical for each time step");
      vertices[t].buffer->commitIfNeeded();
    }

    for (auto& buffer : normals) {
      if (buffer.getStride() != normals[0].getStride())
        throw_RTCError(RTC_ERROR_INVALID_OPERATION,"stride of normal buffers have to be identical for each time step");
      buffer.buffer->commitIfNeeded();
    }

    vertices0 = vertices[0];
    if (getCurveType() == GTY_SUBTYPE_ORIENTED_CURVE)
      normals0 = normals[0];

    /* if no flags buffer is specified we manage and calculate the flags buffer */
    if (!flags.buffer) flags.userData = 0; // to encode that we manage this buffer
    bool recompute_flags_buffer = segments.isLocalModified();

    /* resize flags buffer if number of primitives changed */
    if (!flags.userData && (!flags.buffer || flags.size() != numPrimitives))
    {
      Ref<Buffer> buffer = new Buffer(device, numPrimitives*sizeof(char), nullptr, nullptr);
      flags.set(buffer, 0, sizeof(char), numPrimitives, RTC_FORMAT_UCHAR);
      recompute_flags_buffer = true;
    }

    /* recalculate the flags buffer if index buffer got modified */
    if (!flags.userData && recompute_flags_buffer)
    {
      bool hasLeft = false;
      for (size_t i=0; i<numPrimitives; i++) {
        bool hasRight = (i==numPrimitives-1) ? false : segment(i+1) == segment(i)+1;
        flags[i]  = hasLeft  * RTC_CURVE_FLAG_NEIGHBOR_LEFT;
        flags[i] |= hasRight * RTC_CURVE_FLAG_NEIGHBOR_RIGHT;
        hasLeft = hasRight;
      }
      flags.buffer->commit();
    }

    if (recompute_flags_buffer) {
      segments.buffer->commit();
    }
    segments.clearLocalModified();

    Geometry::commit();
  }